

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O0

void __thiscall
duckdb_shell::ModeHtmlRenderer::RenderHeader(ModeHtmlRenderer *this,RowResult *result)

{
  ShellState *pSVar1;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RSI;
  long in_RDI;
  char *in_stack_00000008;
  ModeHtmlRenderer *in_stack_00000010;
  idx_t i;
  vector<const_char_*,_std::allocator<const_char_*>_> *col_names;
  char *in_stack_ffffffffffffffc8;
  ShellState *in_stack_ffffffffffffffd0;
  ShellState *this_00;
  ShellState *local_20;
  
  if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
    ShellState::Print(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_20 = (ShellState *)0x0;
    while (this_00 = local_20,
          pSVar1 = (ShellState *)
                   std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RSI),
          this_00 < pSVar1) {
      ShellState::Print(this_00,in_stack_ffffffffffffffc8);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                (in_RSI,(size_type)local_20);
      output_html_string(in_stack_00000010,in_stack_00000008);
      ShellState::Print(this_00,in_stack_ffffffffffffffc8);
      local_20 = (ShellState *)((long)&local_20->db + 1);
    }
    ShellState::Print(this_00,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void RenderHeader(RowResult &result) override {
		if (!show_header) {
			return;
		}
		auto &col_names = result.column_names;
		state.Print("<tr>");
		for (idx_t i = 0; i < col_names.size(); i++) {
			state.Print("<th>");
			output_html_string(col_names[i]);
			state.Print("</th>\n");
		}
		state.Print("</tr>\n");
	}